

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall dlib::resizable_tensor::clear(resizable_tensor *this)

{
  size_t in_RDI;
  gpu_data *unaff_retaddr;
  longlong in_stack_00000008;
  
  set_size(this,in_stack_00000008,(longlong)unaff_retaddr,in_RDI,in_RDI);
  any::clear((any *)0x1b0754);
  gpu_data::set_size(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void clear(
        )
        {
            set_size(0,0,0,0);
            _annotation.clear();
            // free underlying memory
            data_instance.set_size(0);
        }